

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O1

int * getMajorMinorPatch(char *aExecutable)

{
  char *pcVar1;
  int *piVar2;
  
  pcVar1 = getVersion(terminalName::lTerminalName);
  pcVar1 = strtok(pcVar1," ,.-");
  getMajorMinorPatch::lArray[0] = atoi(pcVar1);
  pcVar1 = strtok((char *)0x0," ,.-");
  getMajorMinorPatch::lArray[1] = atoi(pcVar1);
  pcVar1 = strtok((char *)0x0," ,.-");
  getMajorMinorPatch::lArray[2] = atoi(pcVar1);
  piVar2 = getMajorMinorPatch::lArray;
  if ((getMajorMinorPatch::lArray[1] == 0 && getMajorMinorPatch::lArray[0] == 0) &&
      getMajorMinorPatch::lArray[2] == 0) {
    piVar2 = (int *)0x0;
  }
  return piVar2;
}

Assistant:

static int * const getMajorMinorPatch( char const * const aExecutable )
{
	static int lArray [3] ;
	char * lTmp ;

	lTmp = (char *) getVersion(aExecutable);
	lArray[0] = atoi( strtok(lTmp," ,.-") ) ;
	/* printf("lArray0 %d\n", lArray[0]); */
	lArray[1] = atoi( strtok(0," ,.-") ) ;
	/* printf("lArray1 %d\n", lArray[1]); */
	lArray[2] = atoi( strtok(0," ,.-") ) ;
	/* printf("lArray2 %d\n", lArray[2]); */

	if ( !lArray[0] && !lArray[1] && !lArray[2] ) return NULL;
	return lArray ;
}